

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O2

uint __thiscall
Parse::TPTP::addOverloadedPredicate
          (TPTP *this,string *name,int arity,int symbolArity,bool *added,TermList *arg,
          Interpretation integer,Interpretation rational,Interpretation real)

{
  TermList TVar1;
  TermList TVar2;
  UserErrorException *pUVar3;
  int i;
  int i_00;
  int i_01;
  TermList *pTVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string msg;
  TermList srt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  TermList local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (arity != symbolArity) {
    pUVar3 = (UserErrorException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_138,name," is used with ");
    Lib::Int::toString_abi_cxx11_(&local_158,(Int *)(ulong)(uint)arity,i_00);
    std::operator+(&local_118,&local_138,&local_158);
    std::operator+(&local_1c0,&local_118," argument(s) when there were ");
    Lib::Int::toString_abi_cxx11_(&local_178,(Int *)(ulong)(uint)symbolArity,i_01);
    std::operator+(&msg,&local_1c0,&local_178);
    std::operator+(&local_50,&msg," expected");
    Lib::UserErrorException::Exception(pUVar3,&local_50);
    __cxa_throw(pUVar3,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  TVar1 = sortOf(this,arg->_content);
  pTVar4 = arg + -1;
  uVar5 = 1;
  srt = TVar1;
  while( true ) {
    if (arity <= (int)uVar5) {
      TVar2 = Kernel::AtomicSort::intSort();
      if (TVar1._content != TVar2._content) {
        TVar2 = Kernel::AtomicSort::rationalSort();
        integer = rational;
        if (TVar1._content != TVar2._content) {
          TVar2 = Kernel::AtomicSort::realSort();
          integer = real;
          if (TVar1._content != TVar2._content) {
            pUVar3 = (UserErrorException *)__cxa_allocate_exception(0x50);
            std::operator+(&msg,"The symbol ",name);
            std::operator+(&local_90,&msg," is used with a non-numeric type");
            Lib::UserErrorException::Exception(pUVar3,&local_90);
            __cxa_throw(pUVar3,&Lib::UserErrorException::typeinfo,
                        Lib::UserErrorException::~UserErrorException);
          }
        }
      }
      uVar5 = Kernel::Signature::addInterpretedPredicate(DAT_00a14190,integer,name);
      return uVar5;
    }
    TVar2 = sortOf(this,pTVar4->_content);
    if (TVar2._content != TVar1._content) break;
    uVar5 = uVar5 + 1;
    pTVar4 = pTVar4 + -1;
  }
  std::operator+(&local_1c0,"The interpreted predicate symbol ",name);
  std::operator+(&msg,&local_1c0," is not used with a single sort.");
  std::__cxx11::string::~string((string *)&local_1c0);
  Kernel::TermList::toString_abi_cxx11_(&local_b0,&srt,false);
  std::operator+(&local_178,"\nArgument 0 is ",&local_b0);
  std::operator+(&local_158,&local_178," and argument ");
  Lib::Int::toString_abi_cxx11_(&local_d0,(Int *)(ulong)uVar5,i);
  std::operator+(&local_138,&local_158,&local_d0);
  std::operator+(&local_118,&local_138," is ");
  local_f8 = sortOf(this,pTVar4->_content);
  Kernel::TermList::toString_abi_cxx11_(&local_f0,&local_f8,false);
  std::operator+(&local_1c0,&local_118,&local_f0);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_b0);
  pUVar3 = (UserErrorException *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string((string *)&local_70,(string *)&msg);
  Lib::UserErrorException::Exception(pUVar3,&local_70);
  __cxa_throw(pUVar3,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

unsigned TPTP::addOverloadedPredicate(std::string name,int arity,int symbolArity,bool& added,TermList& arg,
				     Theory::Interpretation integer,Theory::Interpretation rational,
				     Theory::Interpretation real)
{
  if (arity != symbolArity) {
    USER_ERROR(name + " is used with " + Int::toString(arity) + " argument(s) when there were "+Int::toString(symbolArity)+" expected");
  }
  TermList srt = sortOf(arg);
  TermList* n = arg.next();
  for(int i=1;i<arity;i++){
    if(sortOf(*n)!=srt){
      std::string msg = "The interpreted predicate symbol " + name + " is not used with a single sort.";
      msg += "\nArgument 0 is "+srt.toString()+" and argument "+Lib::Int::toString(i)+" is "+sortOf(*n).toString();
      USER_ERROR(msg);
    }
    n = n->next(); 
  }
  
  if (srt == AtomicSort::intSort()) {
    return env.signature->addInterpretedPredicate(integer,name);
  }
  if (srt == AtomicSort::rationalSort()) {
    return env.signature->addInterpretedPredicate(rational,name);
  }
  if (srt == AtomicSort::realSort()) {
    return env.signature->addInterpretedPredicate(real,name);
  }
  USER_ERROR("The symbol " + name + " is used with a non-numeric type");
}